

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

errr finish_parse_feat(parser *p)

{
  _Bool _Var1;
  uint16_t uVar2;
  char *pcVar3;
  int local_18;
  wchar_t fidx;
  wchar_t shop_idx;
  parser *p_local;
  
  uVar2 = 0;
  for (local_18 = 0; local_18 < 0x19; local_18 = local_18 + 1) {
    _Var1 = flag_has_dbg(f_info[local_18].flags,4,0x15,"f_info[fidx].flags","TF_SHOP");
    if (_Var1) {
      uVar2 = uVar2 + 1;
      f_info[local_18].shopnum = (uint8_t)uVar2;
    }
    if ((f_info[local_18].look_prefix != (char *)0x0) &&
       (_Var1 = suffix(f_info[local_18].look_prefix," "), !_Var1)) {
      pcVar3 = string_append(f_info[local_18].look_prefix," ");
      f_info[local_18].look_prefix = pcVar3;
    }
    if ((f_info[local_18].look_in_preposition != (char *)0x0) &&
       (_Var1 = suffix(f_info[local_18].look_in_preposition," "), !_Var1)) {
      pcVar3 = string_append(f_info[local_18].look_in_preposition," ");
      f_info[local_18].look_in_preposition = pcVar3;
    }
  }
  z_info->store_max = uVar2;
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_feat(struct parser *p) {
	int shop_idx = 0, fidx;

	for (fidx = 0; fidx < FEAT_MAX; ++fidx) {
		/*
		 * Assign shop index based on the order within the other
		 * terrain.
		 */
		if (tf_has(f_info[fidx].flags, TF_SHOP)) {
			f_info[fidx].shopnum = ++shop_idx;
		}
		/*
		 * Ensure the prefixes and prepositions end with a space for
		 * ease of use with the targeting code.
		 */
		if (f_info[fidx].look_prefix && !suffix(
				f_info[fidx].look_prefix, " ")) {
			f_info[fidx].look_prefix = string_append(
				f_info[fidx].look_prefix, " ");
		}
		if (f_info[fidx].look_in_preposition && !suffix(
				f_info[fidx].look_in_preposition, " ")) {
			f_info[fidx].look_in_preposition =
				string_append(f_info[fidx].look_in_preposition,
				" ");
		}
	}
	z_info->store_max = shop_idx;

	parser_destroy(p);
	return 0;
}